

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

bool __thiscall
GlassMaterial::sample
          (GlassMaterial *this,Vector3f *col,Hit *hit,Ray *ray,Vector3f *coe,Runtime *rt,bool emit)

{
  mt19937 *g;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  Ray *this_00;
  Ray *v;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 local_c4 [20];
  Ray *local_b0;
  undefined1 local_a4 [12];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Vector2f local_58;
  Vector2f local_50;
  Vector3f local_48;
  Vector3f local_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  g = rt->g;
  v = (Ray *)&ray->d;
  local_c4._12_8_ = coe;
  local_b0 = ray;
  operator-((Vector3f *)v);
  auVar5._0_4_ = Vector3f::dot((Vector3f *)local_c4,&hit->norm);
  auVar5._4_60_ = extraout_var;
  local_68 = auVar5._0_16_;
  local_88 = ZEXT416((uint)this->thickness);
  auVar7._0_8_ = CONCAT44(extraout_var._0_4_,auVar5._0_4_) ^ 0x8000000080000000;
  auVar7._8_4_ = extraout_var._4_4_ ^ 0x80000000;
  auVar7._12_4_ = extraout_var._8_4_ ^ 0x80000000;
  auVar7 = vmaxss_avx(auVar7,local_68);
  auVar9._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
  auVar9._8_4_ = auVar7._8_4_ ^ 0x80000000;
  auVar9._12_4_ = auVar7._12_4_ ^ 0x80000000;
  auVar4 = vfnmadd213ss_fma(auVar7,auVar7,SUB6416(ZEXT464(0x3f800000),0));
  auVar4 = vmaxss_avx(ZEXT816(0) << 0x20,auVar4);
  auVar4 = vsqrtss_avx(auVar4,auVar4);
  auVar4 = ZEXT416((uint)(auVar4._0_4_ * this->refractCoef));
  auVar4 = vfnmadd213ss_fma(auVar4,auVar4,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar4._0_4_ < 0.0) {
    local_98 = auVar7;
    local_78 = auVar9;
    auVar6._0_4_ = sqrtf(auVar4._0_4_);
    auVar6._4_60_ = extraout_var_00;
    auVar4 = auVar6._0_16_;
    auVar9 = local_78;
    auVar7 = local_98;
  }
  else {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
  }
  fVar3 = this->refractCoef;
  auVar2 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar3),auVar4);
  auVar9 = vfmadd213ss_fma(auVar4,ZEXT416((uint)fVar3),auVar7);
  auVar8._0_4_ = auVar2._0_4_ / auVar9._0_4_;
  auVar8._4_12_ = auVar2._4_12_;
  auVar9 = vfnmadd213ss_fma(auVar7,ZEXT416((uint)fVar3),auVar4);
  auVar7 = vfmadd213ss_fma(auVar7,ZEXT416((uint)fVar3),auVar4);
  fVar3 = auVar9._0_4_ / auVar7._0_4_;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),auVar8,auVar8);
  local_98._0_4_ = auVar7._0_4_ * 0.5;
  fVar3 = randf(g);
  if (fVar3 <= (float)local_98._0_4_) {
    Vector2f::Vector2f(&local_58,&hit->pos);
    Texture::get((Texture *)local_a4,(Vector2f *)&this->reflectColor);
    uVar1 = local_c4._12_8_;
    ::operator*((Vector3f *)local_c4._12_8_,(Vector3f *)local_a4);
    Vector3f::operator=((Vector3f *)uVar1,(Vector3f *)local_c4);
    ::operator*(&local_3c,2.0);
    operator-((Vector3f *)v);
    fVar3 = Vector3f::dot(&hit->norm,&local_48);
    ::operator*((Vector3f *)local_a4,fVar3);
    operator+((Vector3f *)local_a4,(Vector3f *)v);
    Vector3f::normalize((Vector3f *)local_c4);
    this_00 = local_b0;
    Ray::pos((Ray *)local_a4,hit->t);
    Vector3f::operator=(&this_00->o,(Vector3f *)local_a4);
  }
  else {
    auVar4._0_12_ = ZEXT812(0);
    auVar4._12_4_ = 0;
    uVar1 = vcmpss_avx512f(auVar4,ZEXT416((uint)local_68._0_4_),0xe);
    local_88._0_4_ = (uint)!(bool)((byte)uVar1 & 1) * local_88._0_4_;
    Vector2f::Vector2f(&local_50,&hit->pos);
    Texture::get((Texture *)local_a4,(Vector2f *)&this->refractColor);
    uVar1 = local_c4._12_8_;
    ::operator*((Vector3f *)local_c4._12_8_,(Vector3f *)local_a4);
    Vector3f::operator=((Vector3f *)uVar1,(Vector3f *)local_c4);
    v = local_b0;
    Ray::pos((Ray *)local_c4,(float)local_88._0_4_ + hit->t);
  }
  Vector3f::operator=(&v->o,(Vector3f *)local_c4);
  return true;
}

Assistant:

bool sample(Vector3f& col, const Hit& hit, Ray& ray, Vector3f& coe, Runtime& rt, bool emit) const override {
		using std::cerr;
		RNG_TYPE& g = *rt.g;
		float co = Vector3f::dot(-ray.d, hit.norm);
		float t = thickness;
		if (co < 0) co = -co, t=0;
		float si = sqrtf(std::max(1 - co * co, float(0)));
		float si2 = si * refractCoef;
		float co2 = sqrt(1 - si2 * si2);
		float rs = (refractCoef * co2 - co) / (refractCoef * co2 + co);
		float rp = (co2 - refractCoef * co) / (co2 + refractCoef * co);
		float r = (rs * rs + rp * rp) / 2;
		//cerr << co << " " << r << "\n";
//		r = 0.25 + 0.5 * r;
		//Vector3f i1=ray.d, i2;
		if (randf(g) > r) {
			coe = coe * refractColor.get(hit.pos);
			ray.o = ray.pos(hit.t+ t);
		}
		else {
			coe = coe * reflectColor.get(hit.pos);
			Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
			ray.o = ray.pos(hit.t); ray.d = np;
		}
		/*
		i2 = ray.d;
		if (Vector3f::dot(i1, -hit.norm) < 0) i1 = -i1;
		if (Vector3f::dot(i2, hit.norm) < 0) i2 = -i2;
		Vector3f b=m->BRDF(i1, i2, hit);*/
		/*
		if (b[0] > 2) b[0] = 2;
		if (b[1] > 2) b[1] = 2;
		if (b[2] > 2) b[2] = 2;*/
		//coe = coe * b; //not actually physical but could work
		return 1;
	}